

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_getinstanceup(HSQUIRRELVM v,SQInteger idx,SQUserPointer *p,SQUserPointer typetag)

{
  SQObjectPtr *pSVar1;
  SQClass *pSVar2;
  char *err;
  
  if (idx < 0) {
    pSVar1 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar1 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  if ((pSVar1->super_SQObject)._type == OT_INSTANCE) {
    *p = ((pSVar1->super_SQObject)._unVal.pTable)->_nodes;
    if (typetag == (SQUserPointer)0x0) {
      return 0;
    }
    pSVar2 = ((pSVar1->super_SQObject)._unVal.pClass)->_base;
    err = "invalid type tag";
    do {
      if (pSVar2->_typetag == typetag) {
        return 0;
      }
      pSVar2 = pSVar2->_base;
    } while (pSVar2 != (SQClass *)0x0);
  }
  else {
    err = "the object is not a class instance";
  }
  sq_throwerror(v,err);
  return -1;
}

Assistant:

SQRESULT sq_getinstanceup(HSQUIRRELVM v, SQInteger idx, SQUserPointer *p,SQUserPointer typetag)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(type(o) != OT_INSTANCE) return sq_throwerror(v,_SC("the object is not a class instance"));
    (*p) = _instance(o)->_userpointer;
    if(typetag != 0) {
        SQClass *cl = _instance(o)->_class;
        do{
            if(cl->_typetag == typetag)
                return SQ_OK;
            cl = cl->_base;
        }while(cl != NULL);
        return sq_throwerror(v,_SC("invalid type tag"));
    }
    return SQ_OK;
}